

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::findAndReplace
          (UnicodeString *this,int32_t start,int32_t length,UnicodeString *oldText,int32_t oldStart,
          int32_t oldLength,UnicodeString *newText,int32_t newStart,int32_t newLength)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int32_t start_00;
  int srcStart;
  int iVar4;
  int srcLength;
  int srcStart_00;
  int32_t iVar5;
  int length_00;
  char16_t *srcChars;
  int32_t iVar6;
  int iVar7;
  int srcLength_00;
  int32_t local_48;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((((uVar1 & 1) == 0) &&
      (uVar2 = (oldText->fUnion).fStackFields.fLengthAndFlags, (uVar2 & 1) == 0)) &&
     (uVar3 = (newText->fUnion).fStackFields.fLengthAndFlags, (uVar3 & 1) == 0)) {
    if ((short)uVar1 < 0) {
      iVar7 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)(short)uVar1 >> 5;
    }
    local_48 = start;
    if (iVar7 < start) {
      local_48 = iVar7;
    }
    if (start < 0) {
      local_48 = 0;
    }
    length_00 = iVar7 - local_48;
    if (length <= iVar7 - local_48) {
      length_00 = length;
    }
    if ((short)uVar2 < 0) {
      iVar6 = (oldText->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)(short)uVar2 >> 5;
    }
    iVar5 = oldStart;
    if (iVar6 < oldStart) {
      iVar5 = iVar6;
    }
    if (oldStart < 0) {
      iVar5 = 0;
    }
    iVar7 = iVar6 - iVar5;
    iVar6 = oldLength;
    if (iVar7 < oldLength) {
      iVar6 = iVar7;
    }
    if ((short)uVar3 < 0) {
      iVar4 = (newText->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)(short)uVar3 >> 5;
    }
    srcStart = newStart;
    if (iVar4 < newStart) {
      srcStart = iVar4;
    }
    if (newStart < 0) {
      srcStart = 0;
    }
    srcLength_00 = iVar4 - srcStart;
    if (newLength <= iVar4 - srcStart) {
      srcLength_00 = newLength;
    }
    if (newLength < 0) {
      srcLength_00 = 0;
    }
    if ((-1 < oldLength) && (iVar6 != 0)) {
      iVar4 = 0;
      if (-1 < length) {
        iVar4 = length_00;
      }
      if ((0 < iVar4) && (iVar6 <= iVar4)) {
        while (uVar1 = (oldText->fUnion).fStackFields.fLengthAndFlags, (uVar1 & 1) == 0) {
          if ((short)uVar1 < 0) {
            iVar4 = (oldText->fUnion).fFields.fLength;
          }
          else {
            iVar4 = (int)(short)uVar1 >> 5;
          }
          srcStart_00 = iVar5;
          if (iVar4 < iVar5) {
            srcStart_00 = iVar4;
          }
          if (iVar5 < 0) {
            srcStart_00 = 0;
          }
          if (iVar7 < 0) {
            return this;
          }
          srcLength = iVar4 - srcStart_00;
          if (srcLength == 0 || iVar4 < srcStart_00) {
            return this;
          }
          if (iVar6 <= srcLength) {
            srcLength = iVar6;
          }
          srcChars = (oldText->fUnion).fStackFields.fBuffer;
          if ((uVar1 & 2) == 0) {
            srcChars = (oldText->fUnion).fFields.fArray;
          }
          start_00 = indexOf(this,srcChars,srcStart_00,srcLength,local_48,length_00);
          if (start_00 < 0) {
            return this;
          }
          doReplace(this,start_00,iVar6,newText,srcStart,srcLength_00);
          length_00 = ((length_00 + local_48) - iVar6) - start_00;
          if (length_00 < 1) {
            return this;
          }
          local_48 = start_00 + srcLength_00;
          if (length_00 < iVar6) {
            return this;
          }
        }
      }
    }
  }
  return this;
}

Assistant:

UnicodeString& 
UnicodeString::findAndReplace(int32_t start,
                  int32_t length,
                  const UnicodeString& oldText,
                  int32_t oldStart,
                  int32_t oldLength,
                  const UnicodeString& newText,
                  int32_t newStart,
                  int32_t newLength)
{
  if(isBogus() || oldText.isBogus() || newText.isBogus()) {
    return *this;
  }

  pinIndices(start, length);
  oldText.pinIndices(oldStart, oldLength);
  newText.pinIndices(newStart, newLength);

  if(oldLength == 0) {
    return *this;
  }

  while(length > 0 && length >= oldLength) {
    int32_t pos = indexOf(oldText, oldStart, oldLength, start, length);
    if(pos < 0) {
      // no more oldText's here: done
      break;
    } else {
      // we found oldText, replace it by newText and go beyond it
      replace(pos, oldLength, newText, newStart, newLength);
      length -= pos + oldLength - start;
      start = pos + newLength;
    }
  }

  return *this;
}